

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar1 = p->tableSize;
  uVar6 = (ulong)uVar1;
  uVar7 = (p->p).choice >> 2 & 0xfffffffc;
  iVar11 = *(int *)((long)ProbPrices + (ulong)uVar7);
  iVar2 = *(int *)((long)ProbPrices + (ulong)(uVar7 ^ 0x1fc));
  uVar7 = (p->p).choice2 >> 2 & 0xfffffffc;
  iVar3 = *(int *)((long)ProbPrices + (ulong)uVar7);
  iVar4 = *(int *)((long)ProbPrices + (ulong)(uVar7 ^ 0x1fc));
  uVar7 = 7;
  if (uVar1 < 7) {
    uVar7 = uVar1;
  }
  uVar7 = 0x10 - uVar7;
  uVar12 = 7;
  if (uVar6 < 7) {
    uVar12 = uVar6;
  }
  uVar12 = uVar12 + 1;
  uVar5 = 0;
  do {
    uVar13 = uVar5;
    if (uVar13 == uVar6) goto LAB_001118fa;
    uVar14 = (ulong)uVar7;
    iVar10 = 0;
    uVar9 = (uint)uVar13 | 8;
    do {
      uVar8 = uVar9 >> 1;
      iVar10 = iVar10 + ProbPrices
                        [(-(uVar9 & 1) & 0x7f0 ^
                         (uint)*(ushort *)
                                ((long)(p->p).low +
                                (ulong)(uVar9 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
      uVar9 = uVar8;
    } while (uVar8 != 1);
    p->prices[posState][uVar13] = iVar10 + iVar11;
    uVar7 = uVar7 + 1;
    uVar5 = uVar13 + 1;
  } while (uVar13 + 1 != 8);
  uVar7 = 8;
  if (uVar13 < 0xf) {
    do {
      if (uVar6 <= uVar12) goto LAB_001118fa;
      iVar11 = 0;
      uVar7 = (int)uVar12 - 8U | 8;
      do {
        uVar9 = uVar7 >> 1;
        iVar11 = iVar11 + ProbPrices
                          [(-(uVar7 & 1) & 0x7f0 ^
                           (uint)*(ushort *)
                                  ((long)(p->p).mid +
                                  (ulong)(uVar7 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
        uVar7 = uVar9;
      } while (uVar9 != 1);
      p->prices[posState][uVar12] = iVar11 + iVar3 + iVar2;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
    uVar7 = (uint)uVar12;
  }
  if (uVar7 < uVar1) {
    uVar12 = (ulong)uVar7;
    do {
      iVar11 = 0;
      uVar7 = (int)uVar12 - 0x10U | 0x100;
      do {
        uVar9 = uVar7 >> 1;
        iVar11 = iVar11 + ProbPrices
                          [(-(uVar7 & 1) & 0x7f0 ^
                           (uint)*(ushort *)((long)(p->p).high + (ulong)(uVar7 & 0xfffffffe))) >> 4]
        ;
        uVar7 = uVar9;
      } while (uVar9 != 1);
      p->prices[posState][uVar12] = iVar11 + iVar2 + iVar4;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar6);
  }
LAB_001118fa:
  p->counters[posState] = uVar1;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc *p, UInt32 posState, const UInt32 *ProbPrices)
{
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}